

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DictTrie.hpp
# Opt level: O2

void __thiscall
cppjieba::DictTrie::CreateTrie
          (DictTrie *this,vector<cppjieba::DictUnit,_std::allocator<cppjieba::DictUnit>_> *dictUnits
          )

{
  pointer pDVar1;
  Trie *this_00;
  size_t i;
  ulong uVar2;
  long lVar3;
  pointer pDVar4;
  DictUnit *local_70;
  vector<const_cppjieba::DictUnit_*,_std::allocator<const_cppjieba::DictUnit_*>_> valuePointers;
  vector<limonp::LocalVector<unsigned_int>,_std::allocator<limonp::LocalVector<unsigned_int>_>_>
  words;
  
  pDVar4 = (dictUnits->super__Vector_base<cppjieba::DictUnit,_std::allocator<cppjieba::DictUnit>_>).
           _M_impl.super__Vector_impl_data._M_start;
  pDVar1 = (dictUnits->super__Vector_base<cppjieba::DictUnit,_std::allocator<cppjieba::DictUnit>_>).
           _M_impl.super__Vector_impl_data._M_finish;
  if (pDVar1 != pDVar4) {
    words.
    super__Vector_base<limonp::LocalVector<unsigned_int>,_std::allocator<limonp::LocalVector<unsigned_int>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    words.
    super__Vector_base<limonp::LocalVector<unsigned_int>,_std::allocator<limonp::LocalVector<unsigned_int>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    words.
    super__Vector_base<limonp::LocalVector<unsigned_int>,_std::allocator<limonp::LocalVector<unsigned_int>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    valuePointers.
    super__Vector_base<const_cppjieba::DictUnit_*,_std::allocator<const_cppjieba::DictUnit_*>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    valuePointers.
    super__Vector_base<const_cppjieba::DictUnit_*,_std::allocator<const_cppjieba::DictUnit_*>_>.
    _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    valuePointers.
    super__Vector_base<const_cppjieba::DictUnit_*,_std::allocator<const_cppjieba::DictUnit_*>_>.
    _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    lVar3 = 0;
    for (uVar2 = 0; uVar2 < (ulong)((long)pDVar1 - (long)pDVar4 >> 7); uVar2 = uVar2 + 1) {
      std::
      vector<limonp::LocalVector<unsigned_int>,_std::allocator<limonp::LocalVector<unsigned_int>_>_>
      ::push_back(&words,(value_type *)((long)(pDVar4->word).buffer_ + lVar3));
      local_70 = (DictUnit *)
                 ((long)(((dictUnits->
                          super__Vector_base<cppjieba::DictUnit,_std::allocator<cppjieba::DictUnit>_>
                          )._M_impl.super__Vector_impl_data._M_start)->word).buffer_ + lVar3);
      std::vector<cppjieba::DictUnit_const*,std::allocator<cppjieba::DictUnit_const*>>::
      emplace_back<cppjieba::DictUnit_const*>
                ((vector<cppjieba::DictUnit_const*,std::allocator<cppjieba::DictUnit_const*>> *)
                 &valuePointers,&local_70);
      pDVar4 = (dictUnits->
               super__Vector_base<cppjieba::DictUnit,_std::allocator<cppjieba::DictUnit>_>)._M_impl.
               super__Vector_impl_data._M_start;
      pDVar1 = (dictUnits->
               super__Vector_base<cppjieba::DictUnit,_std::allocator<cppjieba::DictUnit>_>)._M_impl.
               super__Vector_impl_data._M_finish;
      lVar3 = lVar3 + 0x80;
    }
    this_00 = (Trie *)operator_new(8);
    Trie::Trie(this_00,&words,&valuePointers);
    this->trie_ = this_00;
    std::_Vector_base<const_cppjieba::DictUnit_*,_std::allocator<const_cppjieba::DictUnit_*>_>::
    ~_Vector_base(&valuePointers.
                   super__Vector_base<const_cppjieba::DictUnit_*,_std::allocator<const_cppjieba::DictUnit_*>_>
                 );
    std::
    vector<limonp::LocalVector<unsigned_int>,_std::allocator<limonp::LocalVector<unsigned_int>_>_>::
    ~vector(&words);
    return;
  }
  __assert_fail("dictUnits.size()",
                "/workspace/llm4binary/github/license_all_cmakelists_25/messense[P]cppjieba-cabi/cppjieba/include/cppjieba/DictTrie.hpp"
                ,0xae,"void cppjieba::DictTrie::CreateTrie(const vector<DictUnit> &)");
}

Assistant:

void CreateTrie(const vector<DictUnit>& dictUnits) {
    assert(dictUnits.size());
    vector<Unicode> words;
    vector<const DictUnit*> valuePointers;
    for (size_t i = 0 ; i < dictUnits.size(); i ++) {
      words.push_back(dictUnits[i].word);
      valuePointers.push_back(&dictUnits[i]);
    }

    trie_ = new Trie(words, valuePointers);
  }